

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  undefined8 *puVar1;
  ulong *puVar2;
  long lVar3;
  ctrl_t *pcVar4;
  bool bVar5;
  uintptr_t v;
  slot_type *psVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  byte bVar10;
  size_t sVar11;
  undefined8 uVar12;
  byte bVar13;
  ctrl_t cVar14;
  ulong uVar15;
  FindInfo FVar16;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  char local_3f;
  byte local_3e;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("(!set->fits_in_soo(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe93,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>]"
                 );
  }
  sVar8 = common->capacity_;
  if (sVar8 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>]"
                 );
  }
  bVar10 = 0x80;
  if (sVar8 == 1) {
    AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                *)0x1);
    if (1 < common->size_) {
      psVar6 = soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                         *)common);
      uVar9 = ((ulong)(psVar6->value).first ^ 0x830380) * -0x234dd359734ecb13;
      bVar10 = (byte)(((uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                        (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                        (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                        (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38) ^ (ulong)(psVar6->value).first) *
                      0x5cb22ca68cb134ed >> 0x38) & 0x7f;
      bVar13 = 1;
      goto LAB_00461443;
    }
  }
  bVar13 = 0;
LAB_00461443:
  local_48 = common->capacity_;
  local_40 = (byte)common->size_ & 1;
  local_3f = sVar8 == 1;
  local_58.heap.control = (common->heap_or_soo_).heap.control;
  local_58.heap.slot_array = (MaybeInitializedPtr)(common->heap_or_soo_).heap.slot_array.p;
  local_3e = bVar13;
  CommonFields::set_capacity(common,new_capacity);
  bVar5 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,16ul,true,true,8ul>
                    ((HashSetResizeHelper *)&local_58,common,&local_59,(int)(char)bVar10,8,0x10);
  if (local_48 == 0) {
    __assert_fail("(resize_helper.old_capacity() > 0) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xeb6,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>]"
                 );
  }
  if ((bVar13 | sVar8 != 1) == 1) {
    lVar3 = *(long *)((long)&common->heap_or_soo_ + 8);
    slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                *)common->capacity_);
    if (!bVar5) {
      if (sVar8 == 1) {
        uVar9 = ((ulong)local_58.heap.control ^ 0x830380) * -0x234dd359734ecb13;
        uVar15 = ((uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                   (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                   (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28
                  | uVar9 << 0x38) ^ (ulong)local_58.heap.control) * -0x234dd359734ecb13;
        FVar16 = find_first_non_full<void>
                           (common,uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
                                   (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8
                                   | (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 |
                                   (uVar15 & 0xff00) << 0x28 | uVar15 << 0x38);
        uVar7 = FVar16.offset;
        uVar9 = common->capacity_;
        if (uVar9 <= uVar7) {
LAB_00461671:
          __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x744,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar14 = (ctrl_t)(uVar15 >> 0x38) & ~kEmpty;
        pcVar4 = (common->heap_or_soo_).heap.control;
        pcVar4[uVar7] = cVar14;
        pcVar4[(ulong)((uint)uVar9 & 0xf) + (uVar7 - 0xf & uVar9)] = cVar14;
        common->capacity_ = 0xffffffffffffff9c;
        puVar1 = (undefined8 *)(lVar3 + uVar7 * 0x10);
        *puVar1 = local_58.heap.control;
        ((MaybeInitializedPtr *)(puVar1 + 1))->p = (void *)local_58.heap.slot_array;
        CommonFields::set_capacity(common,uVar9);
      }
      else {
        if (local_3f == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_48 != 0) {
          sVar11 = 0;
          sVar8 = local_48;
          uVar12 = local_58.heap.slot_array;
          do {
            if (local_3f == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (kSentinel < local_58.heap.control[sVar11]) {
              uVar9 = (*(ulong *)uVar12 ^ (ulong)&hash_internal::MixingHashState::kSeed) *
                      -0x234dd359734ecb13;
              uVar15 = ((uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                         (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                         (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38) ^ *(ulong *)uVar12) *
                       -0x234dd359734ecb13;
              FVar16 = find_first_non_full<void>
                                 (common,uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
                                         (uVar15 & 0xff0000000000) >> 0x18 |
                                         (uVar15 & 0xff00000000) >> 8 | (uVar15 & 0xff000000) << 8 |
                                         (uVar15 & 0xff0000) << 0x18 | (uVar15 & 0xff00) << 0x28 |
                                         uVar15 << 0x38);
              uVar7 = FVar16.offset;
              uVar9 = common->capacity_;
              if (uVar9 <= uVar7) goto LAB_00461671;
              cVar14 = (ctrl_t)(uVar15 >> 0x38) & ~kEmpty;
              pcVar4 = (common->heap_or_soo_).heap.control;
              pcVar4[uVar7] = cVar14;
              pcVar4[(ulong)((uint)uVar9 & 0xf) + (uVar7 - 0xf & uVar9)] = cVar14;
              common->capacity_ = 0xffffffffffffff9c;
              uVar15 = *(ulong *)(uVar12 + 8);
              puVar2 = (ulong *)(lVar3 + uVar7 * 0x10);
              *puVar2 = *(ulong *)uVar12;
              puVar2[1] = uVar15;
              CommonFields::set_capacity(common,uVar9);
              sVar8 = local_48;
            }
            sVar11 = sVar11 + 1;
            uVar12 = uVar12 + 0x10;
          } while (sVar11 != sVar8);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
        HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_58,&local_5a,0x10);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }